

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O1

void TTD::NSSnapObjects::ParseAddtlInfo_SnapMapInfo
               (SnapObject *snpObject,FileReader *reader,SlabAllocator *alloc)

{
  uint32 uVar1;
  uint *puVar2;
  void **ppvVar3;
  TTDVar pvVar4;
  uint uVar5;
  
  puVar2 = (uint *)SlabAllocatorBase<0>::SlabAllocateTypeRawSize<16ul>(alloc);
  uVar1 = FileReader::ReadLengthValue(reader,true);
  *puVar2 = uVar1;
  if (uVar1 == 0) {
    puVar2[2] = 0;
    puVar2[3] = 0;
  }
  else {
    ppvVar3 = SlabAllocatorBase<0>::SlabAllocateArray<void*>(alloc,(ulong)uVar1);
    *(void ***)(puVar2 + 2) = ppvVar3;
    FileReader::ReadSequenceStart_WDefaultKey(reader,true);
    if (*puVar2 != 0) {
      uVar5 = 0;
      do {
        (*reader->_vptr_FileReader[4])(reader,(ulong)(uVar5 != 0));
        pvVar4 = NSSnapValues::ParseTTDVar(false,reader);
        *(TTDVar *)(*(long *)(puVar2 + 2) + (ulong)uVar5 * 8) = pvVar4;
        pvVar4 = NSSnapValues::ParseTTDVar(true,reader);
        *(TTDVar *)(*(long *)(puVar2 + 2) + (ulong)(uVar5 + 1) * 8) = pvVar4;
        (*reader->_vptr_FileReader[5])(reader);
        uVar5 = uVar5 + 2;
      } while (uVar5 < *puVar2);
    }
    (*reader->_vptr_FileReader[5])(reader);
  }
  if (snpObject->SnapObjectTag == SnapMapObject) {
    snpObject->AddtlSnapObjectInfo = puVar2;
    return;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

void ParseAddtlInfo_SnapMapInfo(SnapObject* snpObject, FileReader* reader, SlabAllocator& alloc)
        {
            SnapMapInfo* mapInfo = alloc.SlabAllocateStruct<SnapMapInfo>();

            mapInfo->MapSize = reader->ReadLengthValue(true);
            if(mapInfo->MapSize == 0)
            {
                mapInfo->MapKeyValueArray = nullptr;
            }
            else
            {
                mapInfo->MapKeyValueArray = alloc.SlabAllocateArray<TTDVar>(mapInfo->MapSize);

                reader->ReadSequenceStart_WDefaultKey(true);
                for(uint32 i = 0; i < mapInfo->MapSize; i += 2)
                {
                    reader->ReadSequenceStart(i != 0);
                    mapInfo->MapKeyValueArray[i] = NSSnapValues::ParseTTDVar(false, reader);
                    mapInfo->MapKeyValueArray[i + 1] = NSSnapValues::ParseTTDVar(true, reader);
                    reader->ReadSequenceEnd();
                }
                reader->ReadSequenceEnd();
            }

            SnapObjectSetAddtlInfoAs<SnapMapInfo*, SnapObjectType::SnapMapObject>(snpObject, mapInfo);
        }